

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::ReduceMinLayerParams::MergePartialFromCodedStream
          (ReduceMinLayerParams *this,CodedInputStream *input)

{
  bool bVar1;
  byte bVar2;
  uint32 uVar3;
  uint uVar4;
  byte *pbVar5;
  bool *pbVar6;
  char cVar7;
  ulong uVar8;
  pair<unsigned_long,_bool> pVar9;
  
LAB_00139cb1:
  do {
    pbVar5 = input->buffer_;
    uVar3 = 0;
    if (pbVar5 < input->buffer_end_) {
      bVar2 = *pbVar5;
      uVar3 = (uint32)bVar2;
      if ((char)bVar2 < '\x01') goto LAB_00139cd4;
      input->buffer_ = pbVar5 + 1;
      uVar8 = (ulong)bVar2 | 0x100000000;
    }
    else {
LAB_00139cd4:
      uVar3 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar3);
      uVar8 = 0;
      if (uVar3 - 1 < 0x7f) {
        uVar8 = 0x100000000;
      }
      uVar8 = uVar3 | uVar8;
    }
    uVar3 = (uint32)uVar8;
    if ((uVar8 & 0x100000000) == 0) {
LAB_00139cf5:
      if (uVar3 == 0) {
        return true;
      }
      if ((uVar3 & 7) == 4) {
        return true;
      }
      bVar1 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar3);
    }
    else {
      uVar4 = (uint)(uVar8 >> 3) & 0x1fffffff;
      cVar7 = (char)uVar8;
      if (uVar4 == 3) {
        if (cVar7 != '\x18') goto LAB_00139cf5;
        pbVar5 = input->buffer_;
        pbVar6 = &this->reduceall_;
        if ((pbVar5 < input->buffer_end_) && (bVar2 = *pbVar5, -1 < (char)bVar2)) {
LAB_00139d94:
          uVar8 = (ulong)bVar2;
          input->buffer_ = pbVar5 + 1;
        }
        else {
          pVar9 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
          uVar8 = pVar9.first;
          if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            return false;
          }
        }
LAB_00139dc5:
        *pbVar6 = uVar8 != 0;
        goto LAB_00139cb1;
      }
      if (uVar4 == 2) {
        if (cVar7 == '\x10') {
          pbVar5 = input->buffer_;
          pbVar6 = &this->keepdims_;
          if ((pbVar5 < input->buffer_end_) && (bVar2 = *pbVar5, -1 < (char)bVar2))
          goto LAB_00139d94;
          pVar9 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
          uVar8 = pVar9.first;
          if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            return false;
          }
          goto LAB_00139dc5;
        }
        goto LAB_00139cf5;
      }
      if (uVar4 != 1) goto LAB_00139cf5;
      if (cVar7 == '\b') {
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadRepeatedPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                          (1,10,input,&this->axes_);
      }
      else {
        if ((uVar3 & 0xff) != 10) goto LAB_00139cf5;
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPackedPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                          (input,&this->axes_);
      }
    }
    if (bVar1 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool ReduceMinLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.ReduceMinLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated int64 axes = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, this->mutable_axes())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(8u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 1, 10u, input, this->mutable_axes())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool keepDims = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &keepdims_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool reduceAll = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &reduceall_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.ReduceMinLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.ReduceMinLayerParams)
  return false;
#undef DO_
}